

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

bool __thiscall
QToolBarAreaLayout::restoreState
          (QToolBarAreaLayout *this,QDataStream *stream,QList<QToolBar_*> *_toolBars,uchar tmarker,
          bool testing)

{
  QToolBarAreaLayoutInfo *this_00;
  int *piVar1;
  uint uVar2;
  char cVar3;
  QWidget *widget;
  QWidgetItemV2 *this_01;
  int iVar4;
  ulong i;
  int iVar5;
  uint uVar6;
  Orientation orientation;
  uint uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QStringView QVar9;
  QStringView QVar10;
  uchar shown;
  int cnt;
  int pos;
  int lines;
  uint local_100;
  undefined4 uStack_fc;
  storage_type_conflict *local_f8;
  long local_f0;
  QRect local_e8;
  byte local_c9;
  QArrayData *local_c8;
  storage_type_conflict *psStack_c0;
  long local_b8;
  QToolBarAreaLayoutLine local_a8;
  int local_74;
  uint local_70;
  int local_6c;
  QList<QToolBar_*> local_68;
  QToolBarAreaLayoutItem local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.d = (_toolBars->d).d;
  local_68.d.ptr = (_toolBars->d).ptr;
  local_68.d.size = (_toolBars->d).size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_6c = -0x55555556;
  QDataStream::operator>>(stream,&local_6c);
  if (0 < local_6c) {
    iVar4 = 0;
    do {
      local_70 = 0xaaaaaaaa;
      QDataStream::operator>>(stream,(int *)&local_70);
      if (3 < local_70) {
        bVar8 = false;
        goto LAB_004b2cee;
      }
      local_74 = -0x55555556;
      QDataStream::operator>>(stream,&local_74);
      this_00 = this->docks + (int)local_70;
      local_a8.rect.x1.m_i = 0;
      local_a8.rect.y1.m_i = 0;
      local_a8.rect.x2.m_i = -1;
      local_a8.rect.y2.m_i = -1;
      local_a8._20_4_ = 0xaaaaaaaa;
      local_a8.o = this->docks[(int)local_70].o;
      local_a8.toolBarItems.d.d = (Data *)0x0;
      local_a8.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
      local_a8.toolBarItems.d.size = 0;
      if (0 < local_74) {
        iVar5 = 0;
        do {
          local_50.widgetItem = (QLayoutItem *)0x0;
          local_50.pos = 0;
          local_50.size = -1;
          local_50.preferredSize = -1;
          local_50.gap = false;
          local_50._21_3_ = 0xaaaaaa;
          local_b8 = 0;
          local_c8 = (QArrayData *)0x0;
          psStack_c0 = (storage_type_conflict *)0x0;
          ::operator>>(stream,(QString *)&local_c8);
          local_c9 = 0xaa;
          QDataStream::operator>>(stream,&local_c9);
          local_100 = 0xaaaaaaaa;
          QDataStream::operator>>(stream,(int *)&local_100);
          local_50.pos = local_100;
          local_100 = 0xaaaaaaaa;
          QDataStream::operator>>(stream,(int *)&local_100);
          local_50.size = local_100;
          local_e8.x1.m_i = 0;
          local_e8.y1.m_i = 0;
          local_e8.x2.m_i = -1;
          local_e8.y2.m_i = -1;
          local_100 = 0xaaaaaaaa;
          QDataStream::operator>>(stream,(int *)&local_100);
          uVar2 = local_100;
          uVar7 = 0;
          if (tmarker == 0xfc) {
            local_100 = 0xaaaaaaaa;
            QDataStream::operator>>(stream,(int *)&local_100);
            uVar7 = uVar2;
            if ((uVar2 & 1) == 0) {
              local_e8.x2.m_i = -1;
              local_e8.y2.m_i = -1;
              local_e8.x1.m_i = 0;
              local_e8.y1.m_i = 0;
            }
            else {
              uVar6 = uVar2 >> 1 & 0xffff;
              local_e8.x2.m_i = ((uVar2 >> 0x11) - 0x8000) + uVar6;
              local_e8.y1.m_i = (local_100 & 0xffff) - 0x7fff;
              local_e8.x1.m_i = uVar6 - 0x7fff;
              local_e8.y2.m_i = (local_100 >> 0x10) + (local_100 & 0xffff) + -0x8000;
            }
          }
          if (local_68.d.size != 0) {
            i = 0;
            do {
              QObject::objectName();
              if (local_f0 == local_b8) {
                QVar9.m_data = local_f8;
                QVar9.m_size = local_f0;
                QVar10.m_data = psStack_c0;
                QVar10.m_size = local_f0;
                cVar3 = QtPrivate::equalStrings(QVar9,QVar10);
              }
              else {
                cVar3 = '\0';
              }
              piVar1 = (int *)CONCAT44(uStack_fc,local_100);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  QArrayData::deallocate((QArrayData *)CONCAT44(uStack_fc,local_100),2,0x10);
                }
              }
              if (cVar3 != '\0') {
                widget = &QList<QToolBar_*>::takeAt(&local_68,i)->super_QWidget;
                if (widget != (QWidget *)0x0 && !testing) {
                  *(undefined8 *)(*(long *)&widget->field_0x8 + 0xb0) = 0;
                  this_01 = (QWidgetItemV2 *)operator_new(0x58);
                  QWidgetItemV2::QWidgetItemV2(this_01,widget);
                  if ((uVar7 & 1) == 0) {
                    orientation = this_00->o;
                  }
                  else {
                    orientation = Vertical - ((local_c9 & 2) == 0);
                  }
                  local_50.widgetItem = (QLayoutItem *)this_01;
                  QToolBar::setOrientation((QToolBar *)widget,orientation);
                  (**(code **)(*(long *)widget + 0x68))(widget,local_c9 & 1);
                  QToolBarPrivate::setWindowState
                            (*(QToolBarPrivate **)&widget->field_0x8,(bool)((byte)uVar7 & 1),false,
                             &local_e8);
                  local_50.preferredSize = local_50.size;
                  QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::
                  emplace<QToolBarAreaLayoutItem_const&>
                            ((QPodArrayOps<QToolBarAreaLayoutItem> *)&local_a8.toolBarItems,
                             local_a8.toolBarItems.d.size,&local_50);
                  QList<QToolBarAreaLayoutItem>::end(&local_a8.toolBarItems);
                }
                break;
              }
              i = i + 1;
            } while (i < (ulong)local_68.d.size);
          }
          if (local_c8 != (QArrayData *)0x0) {
            LOCK();
            (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_c8,2,0x10);
            }
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_74);
      }
      if (!testing) {
        QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine_const&>
                  ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this_00,(this_00->lines).d.size,
                   &local_a8);
        QList<QToolBarAreaLayoutLine>::end(&this_00->lines);
      }
      if (&(local_a8.toolBarItems.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_a8.toolBarItems.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_a8.toolBarItems.d.d)->super_QArrayData,0x18,0x10);
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_6c);
  }
  bVar8 = stream[0x13] == (QDataStream)0x0;
LAB_004b2cee:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QToolBarAreaLayout::restoreState(QDataStream &stream, const QList<QToolBar*> &_toolBars, uchar tmarker, bool testing)
{
    QList<QToolBar*> toolBars = _toolBars;
    int lines;
    stream >> lines;

    for (int j = 0; j < lines; ++j) {
        int pos;
        stream >> pos;
        if (pos < 0 || pos >= QInternal::DockCount)
            return false;
        int cnt;
        stream >> cnt;

        QToolBarAreaLayoutInfo &dock = docks[pos];
        const bool applyingLayout = !testing;
        QToolBarAreaLayoutLine line(dock.o);

        for (int k = 0; k < cnt; ++k) {
            QToolBarAreaLayoutItem item;

            QString objectName;
            stream >> objectName;
            uchar shown;
            stream >> shown;
            item.pos = getInt(stream);
            item.size = getInt(stream);

            /*
               4.3.0 added floating toolbars, but failed to add the ability to restore them.
               We need to store there geometry (four ints). We cannot change the format in a
               patch release (4.3.1) by adding ToolBarStateMarkerEx2 to signal extra data. So
               for now we'll pack it in the two legacy ints we no longer used in Qt4.3.0.
               In 4.4, we should add ToolBarStateMarkerEx2 and fix this properly.
            */

            QRect rect;
            bool floating = false;
            uint geom0, geom1;
            geom0 = getInt(stream);
            if (tmarker == ToolBarStateMarkerEx) {
                geom1 = getInt(stream);
                rect = unpackRect(geom0, geom1, &floating);
            }

            QToolBar *toolBar = nullptr;
            for (int x = 0; x < toolBars.size(); ++x) {
                if (toolBars.at(x)->objectName() == objectName) {
                    toolBar = toolBars.takeAt(x);
                    break;
                }
            }
            if (toolBar == nullptr) {
                continue;
            }

            if (applyingLayout) {
                // Clear the previous widgetItem for the toolBar, so that it's
                // assigned correctly in QWidgetItemV2 constructor.
                auto *toolBarPrivate = QWidgetPrivate::get(toolBar);
                toolBarPrivate->widgetItem = nullptr;
                item.widgetItem = new QWidgetItemV2(toolBar);
                toolBar->setOrientation(floating ? ((shown & 2) ? Qt::Vertical : Qt::Horizontal) : dock.o);
                toolBar->setVisible(shown & 1);
                toolBar->d_func()->setWindowState(floating, false, rect);

                item.preferredSize = item.size;
                line.toolBarItems.append(item);
            }
        }

        if (applyingLayout) {
            dock.lines.append(line);
        }
    }


    return stream.status() == QDataStream::Ok;
}